

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SAX2.c
# Opt level: O0

xmlAttrPtr
xmlSAX2AttributeNs(xmlParserCtxtPtr ctxt,xmlChar *localname,xmlChar *prefix,xmlChar *value,
                  xmlChar *valueend)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  xmlChar *pxVar4;
  xmlRegisterNodeFunc *pp_Var5;
  xmlNodePtr pxVar6;
  xmlChar **name;
  int res_1;
  xmlChar *content;
  xmlChar *fullname;
  xmlChar fn [50];
  xmlChar *nvalnorm;
  xmlNodePtr tmp_1;
  xmlNodePtr tmp;
  xmlChar *pxStack_50;
  int res;
  xmlChar *dup;
  xmlNsPtr namespace;
  xmlAttrPtr ret;
  xmlChar *valueend_local;
  xmlChar *value_local;
  xmlChar *prefix_local;
  xmlChar *localname_local;
  xmlParserCtxtPtr ctxt_local;
  
  dup = (xmlChar *)0x0;
  pxStack_50 = (xmlChar *)0x0;
  ret = (xmlAttrPtr)valueend;
  valueend_local = value;
  value_local = prefix;
  prefix_local = localname;
  localname_local = (xmlChar *)ctxt;
  if ((((prefix != (xmlChar *)0x0) &&
       (dup = (xmlChar *)xmlParserNsLookupSax(ctxt,prefix), dup == (xmlChar *)0x0)) &&
      (iVar2 = xmlStrEqual(value_local,(xmlChar *)"xml"), iVar2 != 0)) &&
     (iVar2 = xmlSearchNsSafe(*(xmlNodePtr *)(localname_local + 0x50),value_local,(xmlNsPtr *)&dup),
     iVar2 < 0)) {
    xmlSAX2ErrMemory((xmlParserCtxtPtr)localname_local);
  }
  if (*(long *)(localname_local + 0x250) == 0) {
    namespace = (xmlNsPtr)(*xmlMalloc)(0x68);
    if (namespace == (xmlNsPtr)0x0) {
      xmlSAX2ErrMemory((xmlParserCtxtPtr)localname_local);
      return (xmlAttrPtr)0x0;
    }
  }
  else {
    namespace = *(xmlNsPtr *)(localname_local + 0x250);
    *(_xmlNs **)(localname_local + 0x250) = namespace[1].next;
    *(int *)(localname_local + 0x248) = *(int *)(localname_local + 0x248) + -1;
  }
  memset(namespace,0,0x68);
  namespace->type = XML_ATTRIBUTE_NODE;
  namespace->context = *(_xmlDoc **)(localname_local + 0x50);
  namespace[1].href = *(xmlChar **)(*(long *)(localname_local + 0x50) + 0x40);
  namespace[1].prefix = dup;
  if (*(int *)(localname_local + 0x238) == 0) {
    pxVar4 = xmlStrdup(prefix_local);
    namespace->href = pxVar4;
    if (namespace->href == (xmlChar *)0x0) {
      xmlSAX2ErrMemory((xmlParserCtxtPtr)localname_local);
    }
  }
  else {
    namespace->href = prefix_local;
  }
  if ((xmlRegisterCallbacks != 0) &&
     (pp_Var5 = __xmlRegisterNodeDefaultValue(), *pp_Var5 != (xmlRegisterNodeFunc)0x0)) {
    pp_Var5 = __xmlRegisterNodeDefaultValue();
    (**pp_Var5)((xmlNodePtr)namespace);
  }
  iVar2 = (int)ret;
  iVar1 = (int)valueend_local;
  if ((*(int *)(localname_local + 0x1c) == 0) && (*(int *)(localname_local + 0x34) == 0)) {
    if (*(char *)&ret->_private == '\0') {
      if ((valueend_local < ret) &&
         (iVar2 = xmlNodeParseContent((xmlNodePtr)namespace,valueend_local,iVar2 - iVar1), iVar2 < 0
         )) {
        xmlSAX2ErrMemory((xmlParserCtxtPtr)localname_local);
      }
    }
    else {
      pxVar6 = xmlSAX2TextNode((xmlParserCtxtPtr)localname_local,valueend_local,iVar2 - iVar1);
      namespace->prefix = (xmlChar *)pxVar6;
      namespace->_private = pxVar6;
      if (pxVar6 != (xmlNodePtr)0x0) {
        pxVar6->doc = (_xmlDoc *)namespace[1].href;
        pxVar6->parent = (_xmlNode *)namespace;
      }
    }
  }
  else if (valueend_local != (xmlChar *)0x0) {
    pxVar6 = xmlSAX2TextNode((xmlParserCtxtPtr)localname_local,valueend_local,iVar2 - iVar1);
    namespace->prefix = (xmlChar *)pxVar6;
    namespace->_private = pxVar6;
    if (pxVar6 != (xmlNodePtr)0x0) {
      pxVar6->doc = (_xmlDoc *)namespace[1].href;
      pxVar6->parent = (_xmlNode *)namespace;
    }
  }
  if ((((*(int *)(localname_local + 0x34) == 0) && (*(int *)(localname_local + 0x9c) != 0)) &&
      (*(int *)(localname_local + 0x18) != 0)) &&
     ((*(long *)(localname_local + 0x10) != 0 &&
      (*(long *)(*(long *)(localname_local + 0x10) + 0x50) != 0)))) {
    if (*(int *)(localname_local + 0x1c) == 0) {
      pxStack_50 = xmlSAX2DecodeAttrEntities
                             ((xmlParserCtxtPtr)localname_local,valueend_local,(xmlChar *)ret);
      if (pxStack_50 == (xmlChar *)0x0) {
        if (*(char *)&ret->_private == '\0') {
          uVar3 = xmlValidateOneAttribute
                            ((xmlValidCtxtPtr)(localname_local + 0xa0),
                             *(xmlDocPtr *)(localname_local + 0x10),
                             *(xmlNodePtr *)(localname_local + 0x50),(xmlAttrPtr)namespace,
                             valueend_local);
          *(uint *)(localname_local + 0x98) = uVar3 & *(uint *)(localname_local + 0x98);
        }
        else {
          pxStack_50 = xmlStrndup(valueend_local,(int)ret - (int)valueend_local);
          if (pxStack_50 == (xmlChar *)0x0) {
            xmlSAX2ErrMemory((xmlParserCtxtPtr)localname_local);
          }
          uVar3 = xmlValidateOneAttribute
                            ((xmlValidCtxtPtr)(localname_local + 0xa0),
                             *(xmlDocPtr *)(localname_local + 0x10),
                             *(xmlNodePtr *)(localname_local + 0x50),(xmlAttrPtr)namespace,
                             pxStack_50);
          *(uint *)(localname_local + 0x98) = uVar3 & *(uint *)(localname_local + 0x98);
        }
      }
      else {
        if (*(long *)(localname_local + 0x228) != 0) {
          name = (xmlChar **)xmlBuildQName(prefix_local,value_local,(xmlChar *)&fullname,0x32);
          if (name == (xmlChar **)0x0) {
            xmlSAX2ErrMemory((xmlParserCtxtPtr)localname_local);
          }
          else {
            localname_local[0xe0] = '\x01';
            localname_local[0xe1] = '\0';
            localname_local[0xe2] = '\0';
            localname_local[0xe3] = '\0';
            register0x00000000 =
                 xmlValidCtxtNormalizeAttributeValue
                           ((xmlValidCtxtPtr)(localname_local + 0xa0),
                            *(xmlDocPtr *)(localname_local + 0x10),
                            *(xmlNodePtr *)(localname_local + 0x50),(xmlChar *)name,pxStack_50);
            if (*(int *)(localname_local + 0xe0) != 1) {
              localname_local[0x98] = '\0';
              localname_local[0x99] = '\0';
              localname_local[0x9a] = '\0';
              localname_local[0x9b] = '\0';
            }
            if ((name != &fullname) && (name != (xmlChar **)prefix_local)) {
              (*xmlFree)(name);
            }
            if (stack0xffffffffffffff90 != (xmlChar *)0x0) {
              (*xmlFree)(pxStack_50);
              pxStack_50 = stack0xffffffffffffff90;
            }
          }
        }
        uVar3 = xmlValidateOneAttribute
                          ((xmlValidCtxtPtr)(localname_local + 0xa0),
                           *(xmlDocPtr *)(localname_local + 0x10),
                           *(xmlNodePtr *)(localname_local + 0x50),(xmlAttrPtr)namespace,pxStack_50)
        ;
        *(uint *)(localname_local + 0x98) = uVar3 & *(uint *)(localname_local + 0x98);
      }
    }
    else {
      pxStack_50 = xmlStrndup(valueend_local,(int)ret - (int)valueend_local);
      if (pxStack_50 == (xmlChar *)0x0) {
        xmlSAX2ErrMemory((xmlParserCtxtPtr)localname_local);
      }
      uVar3 = xmlValidateOneAttribute
                        ((xmlValidCtxtPtr)(localname_local + 0xa0),
                         *(xmlDocPtr *)(localname_local + 0x10),
                         *(xmlNodePtr *)(localname_local + 0x50),(xmlAttrPtr)namespace,pxStack_50);
      *(uint *)(localname_local + 0x98) = uVar3 & *(uint *)(localname_local + 0x98);
    }
  }
  else if (((((*(uint *)(localname_local + 0x1b0) & 8) == 0) &&
            ((*(long *)(*(long *)(localname_local + 0x38) + 0x70) == 0 &&
             (namespace->prefix != (xmlChar *)0x0)))) && (*(int *)(namespace->prefix + 8) == 3)) &&
          (*(long *)(namespace->prefix + 0x30) == 0)) {
    pxVar4 = *(xmlChar **)(namespace->prefix + 0x50);
    if ((((value_local == *(xmlChar **)(localname_local + 0x1e0)) && (*prefix_local == 'i')) &&
        (prefix_local[1] == 'd')) && (prefix_local[2] == '\0')) {
      iVar2 = xmlValidateNCName(pxVar4,1);
      if (iVar2 != 0) {
        xmlErrValid((xmlParserCtxtPtr)localname_local,XML_DTD_XMLID_VALUE,
                    "xml:id : attribute value %s is not an NCName\n",pxVar4,(xmlChar *)0x0);
      }
      xmlAddID((xmlValidCtxtPtr)(localname_local + 0xa0),*(xmlDocPtr *)(localname_local + 0x10),
               pxVar4,(xmlAttrPtr)namespace);
    }
    else {
      iVar2 = xmlIsID(*(xmlDocPtr *)(localname_local + 0x10),*(xmlNodePtr *)(localname_local + 0x50)
                      ,(xmlAttrPtr)namespace);
      if (iVar2 < 0) {
        xmlCtxtErrMemory((xmlParserCtxtPtr)localname_local);
      }
      else if (iVar2 < 1) {
        iVar2 = xmlIsRef(*(xmlDocPtr *)(localname_local + 0x10),
                         *(xmlNodePtr *)(localname_local + 0x50),(xmlAttrPtr)namespace);
        if (iVar2 != 0) {
          xmlAddRef((xmlValidCtxtPtr)(localname_local + 0xa0),*(xmlDocPtr *)(localname_local + 0x10)
                    ,pxVar4,(xmlAttrPtr)namespace);
        }
      }
      else {
        xmlAddID((xmlValidCtxtPtr)(localname_local + 0xa0),*(xmlDocPtr *)(localname_local + 0x10),
                 pxVar4,(xmlAttrPtr)namespace);
      }
    }
  }
  if (pxStack_50 != (xmlChar *)0x0) {
    (*xmlFree)(pxStack_50);
  }
  return (xmlAttrPtr)namespace;
}

Assistant:

static xmlAttrPtr
xmlSAX2AttributeNs(xmlParserCtxtPtr ctxt,
                   const xmlChar * localname,
                   const xmlChar * prefix,
		   const xmlChar * value,
		   const xmlChar * valueend)
{
    xmlAttrPtr ret;
    xmlNsPtr namespace = NULL;
    xmlChar *dup = NULL;

    /*
     * Note: if prefix == NULL, the attribute is not in the default namespace
     */
    if (prefix != NULL) {
	namespace = xmlParserNsLookupSax(ctxt, prefix);
	if ((namespace == NULL) && (xmlStrEqual(prefix, BAD_CAST "xml"))) {
            int res;

	    res = xmlSearchNsSafe(ctxt->node, prefix, &namespace);
            if (res < 0)
                xmlSAX2ErrMemory(ctxt);
	}
    }

    /*
     * allocate the node
     */
    if (ctxt->freeAttrs != NULL) {
        ret = ctxt->freeAttrs;
	ctxt->freeAttrs = ret->next;
	ctxt->freeAttrsNr--;
    } else {
        ret = xmlMalloc(sizeof(*ret));
        if (ret == NULL) {
            xmlSAX2ErrMemory(ctxt);
            return(NULL);
        }
    }

    memset(ret, 0, sizeof(xmlAttr));
    ret->type = XML_ATTRIBUTE_NODE;

    /*
     * xmlParseBalancedChunkMemoryRecover had a bug that could result in
     * a mismatch between ctxt->node->doc and ctxt->myDoc. We use
     * ctxt->node->doc here, but we should somehow make sure that the
     * document pointers match.
     */

    /* assert(ctxt->node->doc == ctxt->myDoc); */

    ret->parent = ctxt->node;
    ret->doc = ctxt->node->doc;
    ret->ns = namespace;

    if (ctxt->dictNames) {
        ret->name = localname;
    } else {
        ret->name = xmlStrdup(localname);
        if (ret->name == NULL)
            xmlSAX2ErrMemory(ctxt);
    }

    if ((xmlRegisterCallbacks) && (xmlRegisterNodeDefaultValue))
        xmlRegisterNodeDefaultValue((xmlNodePtr)ret);

    if ((ctxt->replaceEntities == 0) && (!ctxt->html)) {
	xmlNodePtr tmp;

	/*
	 * We know that if there is an entity reference, then
	 * the string has been dup'ed and terminates with 0
	 * otherwise with ' or "
	 */
	if (*valueend != 0) {
	    tmp = xmlSAX2TextNode(ctxt, value, valueend - value);
	    ret->children = tmp;
	    ret->last = tmp;
	    if (tmp != NULL) {
		tmp->doc = ret->doc;
		tmp->parent = (xmlNodePtr) ret;
	    }
	} else if (valueend > value) {
            if (xmlNodeParseContent((xmlNodePtr) ret, value,
                                    valueend - value) < 0)
                xmlSAX2ErrMemory(ctxt);
	}
    } else if (value != NULL) {
	xmlNodePtr tmp;

	tmp = xmlSAX2TextNode(ctxt, value, valueend - value);
	ret->children = tmp;
	ret->last = tmp;
	if (tmp != NULL) {
	    tmp->doc = ret->doc;
	    tmp->parent = (xmlNodePtr) ret;
	}
    }

#ifdef LIBXML_VALID_ENABLED
    if ((!ctxt->html) && ctxt->validate && ctxt->wellFormed &&
        ctxt->myDoc && ctxt->myDoc->intSubset) {
	/*
	 * If we don't substitute entities, the validation should be
	 * done on a value with replaced entities anyway.
	 */
        if (!ctxt->replaceEntities) {
	    dup = xmlSAX2DecodeAttrEntities(ctxt, value, valueend);
	    if (dup == NULL) {
	        if (*valueend == 0) {
		    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				    ctxt->myDoc, ctxt->node, ret, value);
		} else {
		    /*
		     * That should already be normalized.
		     * cheaper to finally allocate here than duplicate
		     * entry points in the full validation code
		     */
		    dup = xmlStrndup(value, valueend - value);
                    if (dup == NULL)
                        xmlSAX2ErrMemory(ctxt);

		    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
				    ctxt->myDoc, ctxt->node, ret, dup);
		}
	    } else {
	        /*
		 * dup now contains a string of the flattened attribute
		 * content with entities substituted. Check if we need to
		 * apply an extra layer of normalization.
		 * It need to be done twice ... it's an extra burden related
		 * to the ability to keep references in attributes
		 */
		if (ctxt->attsSpecial != NULL) {
		    xmlChar *nvalnorm;
		    xmlChar fn[50];
		    xmlChar *fullname;

		    fullname = xmlBuildQName(localname, prefix, fn, 50);
                    if (fullname == NULL) {
                        xmlSAX2ErrMemory(ctxt);
                    } else {
			ctxt->vctxt.valid = 1;
		        nvalnorm = xmlValidCtxtNormalizeAttributeValue(
			                 &ctxt->vctxt, ctxt->myDoc,
					 ctxt->node, fullname, dup);
			if (ctxt->vctxt.valid != 1)
			    ctxt->valid = 0;

			if ((fullname != fn) && (fullname != localname))
			    xmlFree(fullname);
			if (nvalnorm != NULL) {
			    xmlFree(dup);
			    dup = nvalnorm;
			}
		    }
		}

		ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
			        ctxt->myDoc, ctxt->node, ret, dup);
	    }
	} else {
	    /*
	     * if entities already have been substituted, then
	     * the attribute as passed is already normalized
	     */
	    dup = xmlStrndup(value, valueend - value);
            if (dup == NULL)
                xmlSAX2ErrMemory(ctxt);

	    ctxt->valid &= xmlValidateOneAttribute(&ctxt->vctxt,
	                             ctxt->myDoc, ctxt->node, ret, dup);
	}
    } else
#endif /* LIBXML_VALID_ENABLED */
           if (((ctxt->loadsubset & XML_SKIP_IDS) == 0) &&
               (ctxt->input->entity == NULL) &&
               /* Don't create IDs containing entity references */
               (ret->children != NULL) &&
               (ret->children->type == XML_TEXT_NODE) &&
               (ret->children->next == NULL)) {
        xmlChar *content = ret->children->content;
        /*
	 * when validating, the ID registration is done at the attribute
	 * validation level. Otherwise we have to do specific handling here.
	 */
        if ((prefix == ctxt->str_xml) &&
	           (localname[0] == 'i') && (localname[1] == 'd') &&
		   (localname[2] == 0)) {
	    /*
	     * Add the xml:id value
	     *
	     * Open issue: normalization of the value.
	     */
	    if (xmlValidateNCName(content, 1) != 0) {
	        xmlErrValid(ctxt, XML_DTD_XMLID_VALUE,
                            "xml:id : attribute value %s is not an NCName\n",
                            content, NULL);
	    }
	    xmlAddID(&ctxt->vctxt, ctxt->myDoc, content, ret);
	} else {
            int res = xmlIsID(ctxt->myDoc, ctxt->node, ret);

            if (res < 0)
                xmlCtxtErrMemory(ctxt);
            else if (res > 0)
                xmlAddID(&ctxt->vctxt, ctxt->myDoc, content, ret);
            else if (xmlIsRef(ctxt->myDoc, ctxt->node, ret))
                xmlAddRef(&ctxt->vctxt, ctxt->myDoc, content, ret);
	}
    }
    if (dup != NULL)
	xmlFree(dup);

    return(ret);
}